

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnIfExpr(BinaryReaderInterp *this,Type sig_type)

{
  Result RVar1;
  Offset fixup_offset;
  
  RVar1 = SharedValidator::OnIf
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     sig_type);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,InterpBrUnless);
    fixup_offset = Istream::EmitFixupU32(this->istream_);
    PushLabel(this,0xffffffff,fixup_offset);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnIfExpr(Type sig_type) {
  CHECK_RESULT(validator_.OnIf(loc, sig_type));
  istream_.Emit(Opcode::InterpBrUnless);
  auto fixup = istream_.EmitFixupU32();
  PushLabel(Istream::kInvalidOffset, fixup);
  return Result::Ok;
}